

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O2

void __thiscall
chrono::ChFrame<double>::SetCoord
          (ChFrame<double> *this,ChVector<double> *mv,ChQuaternion<double> *mq)

{
  if (&this->coord != (ChCoordsys<double> *)mv) {
    (this->coord).pos.m_data[0] = mv->m_data[0];
    (this->coord).pos.m_data[1] = mv->m_data[1];
    (this->coord).pos.m_data[2] = mv->m_data[2];
  }
  ChQuaternion<double>::operator=(&(this->coord).rot,mq);
  ChMatrix33<double>::Set_A_quaternion(&this->Amatrix,mq);
  return;
}

Assistant:

void SetCoord(const ChVector<Real>& mv, const ChQuaternion<Real>& mq) {
        coord.pos = mv;
        coord.rot = mq;
        Amatrix.Set_A_quaternion(mq);
    }